

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  int *piVar1;
  byte bVar2;
  xmlChar xVar3;
  xmlChar *pxVar4;
  xmlParserInputBufferPtr pxVar5;
  setDocumentLocatorSAXFunc p_Var6;
  startDocumentSAXFunc p_Var7;
  xmlDocPtr doc;
  _xmlSAXHandler *p_Var8;
  externalSubsetSAXFunc p_Var9;
  int iVar10;
  int iVar11;
  xmlParserInputState xVar12;
  xmlChar *pxVar13;
  long lVar14;
  uint uVar15;
  xmlParserErrors code;
  int *piVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  xmlParserInputPtr pxVar20;
  byte *pbVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  xmlChar *URI;
  xmlChar *prefix;
  char *msg;
  char *pcVar26;
  int local_54;
  xmlChar *local_50;
  xmlChar *local_48;
  uint local_3c;
  xmlValidCtxtPtr local_38;
  
  if (size < 0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0x73;
  }
  if (chunk == (char *)0x0 && 0 < size) {
    return 0x73;
  }
  pxVar20 = ctxt->input;
  if (pxVar20 == (xmlParserInputPtr)0x0) {
    return 0x73;
  }
  if (pxVar20->buf == (xmlParserInputBufferPtr)0x0) {
    return 0x73;
  }
  if (ctxt->disableSAX != 0) goto LAB_0013db0c;
  *(byte *)&pxVar20->flags = (byte)pxVar20->flags | 0x40;
  if (ctxt->instate == XML_PARSER_START) {
    xmlCtxtInitializeLate(ctxt);
  }
  bVar25 = false;
  if (((terminate == 0) && (chunk != (char *)0x0)) && (0 < size)) {
    bVar25 = chunk[(ulong)(uint)size - 1] == '\r';
    size = size - (uint)bVar25;
  }
  pxVar20 = ctxt->input;
  pxVar13 = pxVar20->cur;
  pxVar4 = pxVar20->base;
  iVar10 = xmlParserInputBufferPush(pxVar20->buf,size,chunk);
  xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar13 - (long)pxVar4);
  pxVar20 = ctxt->input;
  if (iVar10 < 0) {
    xmlCtxtErrIO(ctxt,pxVar20->buf->error,(char *)0x0);
    xmlHaltParser(ctxt);
    goto LAB_0013db0c;
  }
  if (pxVar20 == (xmlParserInputPtr)0x0) {
switchD_0013dd64_caseD_ffffffff:
    uVar17 = 1000000000;
    if ((ctxt->options & 0x80000) == 0) {
      uVar17 = 10000000;
    }
    if (uVar17 < (ulong)((long)ctxt->input->cur - (long)ctxt->input->base)) {
      xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
      xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != 0) && (ctxt->disableSAX != 0)) {
      return ctxt->errNo;
    }
    if (bVar25) {
      pxVar20 = ctxt->input;
      pxVar13 = pxVar20->cur;
      pxVar4 = pxVar20->base;
      iVar10 = xmlParserInputBufferPush(pxVar20->buf,1,"\r");
      xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar13 - (long)pxVar4);
      if (iVar10 < 0) {
        xmlCtxtErrIO(ctxt,ctxt->input->buf->error,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_0013db0c;
      }
    }
    if (terminate != 0) {
      xVar12 = ctxt->instate;
      if ((xVar12 == XML_PARSER_EOF) || (xVar12 == XML_PARSER_EPILOG)) {
        pxVar5 = ctxt->input->buf;
        if ((pxVar5->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
           ((pxVar5->error == 0 && (iVar10 = xmlBufIsEmpty(pxVar5->raw), iVar10 == 0)))) {
          pcVar26 = "Truncated multi-byte sequence at EOF\n";
          code = XML_ERR_INVALID_CHAR;
LAB_0013e993:
          msg = "%s";
          iVar10 = 0;
          pxVar13 = (xmlChar *)0x0;
          goto LAB_0013e99c;
        }
      }
      else if (ctxt->nameNr < 1) {
        if (xVar12 != XML_PARSER_START) {
          pcVar26 = "Start tag expected, \'<\' not found\n";
          code = XML_ERR_DOCUMENT_EMPTY;
          goto LAB_0013e993;
        }
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
      }
      else {
        uVar15 = ctxt->nameNr - 1;
        pxVar13 = ctxt->nameTab[uVar15];
        iVar10 = ctxt->pushTab[uVar15].line;
        msg = "Premature end of data in tag %s line %d\n";
        code = XML_ERR_TAG_NOT_FINISHED;
        pcVar26 = (char *)pxVar13;
LAB_0013e99c:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,pxVar13,(xmlChar *)0x0,
                   (xmlChar *)0x0,iVar10,msg,pcVar26);
      }
      if (ctxt->instate != XML_PARSER_EOF) {
        ctxt->instate = XML_PARSER_EOF;
        xmlFinishDocument(ctxt);
      }
    }
    if (ctxt->wellFormed != 0) {
      return 0;
    }
LAB_0013db0c:
    return ctxt->errNo;
  }
  if (0x1000 < (long)pxVar20->cur - (long)pxVar20->base) {
    xmlParserShrink(ctxt);
  }
  if (ctxt->disableSAX != 0) goto switchD_0013dd64_caseD_ffffffff;
  local_3c = (uint)(terminate == 0);
  local_38 = &ctxt->vctxt;
LAB_0013dd2d:
  pxVar20 = ctxt->input;
  pxVar13 = pxVar20->cur;
  pbVar19 = pxVar20->end;
  uVar17 = (long)pbVar19 - (long)pxVar13;
  if (uVar17 == 0) goto switchD_0013dd64_caseD_ffffffff;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if (((terminate == 0) && (uVar17 < 4)) ||
       ((*pxVar13 == 'L' &&
        ((((pxVar13[1] == 'o' && (pxVar13[2] == 0xa7)) && (terminate == 0)) &&
         ((uVar17 < 200 && (pxVar13[3] == 0x94)))))))) goto switchD_0013dd64_caseD_ffffffff;
    xmlDetectEncoding(ctxt);
    ctxt->instate = XML_PARSER_XML_DECL;
    break;
  case XML_PARSER_MISC:
  case XML_PARSER_PROLOG:
  case XML_PARSER_EPILOG:
    xmlSkipBlankChars(ctxt);
    pxVar13 = ctxt->input->cur;
    pxVar4 = ctxt->input->end;
    uVar17 = (long)pxVar4 - (long)pxVar13;
    if (pxVar4 == pxVar13) goto switchD_0013dd64_caseD_ffffffff;
    if (*pxVar13 == '<') {
      if ((terminate == 0) && (uVar17 < 2)) goto switchD_0013dd64_caseD_ffffffff;
      if (pxVar13[1] == '!') {
        if ((terminate == 0) && (uVar17 < 3)) goto switchD_0013dd64_caseD_ffffffff;
        if (pxVar13[2] == '-') {
          if ((terminate == 0) && (uVar17 < 4)) goto switchD_0013dd64_caseD_ffffffff;
          if (pxVar13[3] == '-') {
            if ((terminate != 0) ||
               (pxVar13 = xmlParseLookupString(ctxt,4,"-->",3), pxVar13 != (xmlChar *)0x0)) {
              xmlParseComment(ctxt);
              break;
            }
            goto switchD_0013dd64_caseD_ffffffff;
          }
        }
        else if (ctxt->instate == XML_PARSER_MISC) {
          if ((terminate == 0) && (uVar17 < 9)) goto switchD_0013dd64_caseD_ffffffff;
          if (((pxVar13[2] == 'D') &&
              (((pxVar13[3] == 'O' && (pxVar13[4] == 'C')) && (pxVar13[5] == 'T')))) &&
             (((pxVar13[6] == 'Y' && (pxVar13[7] == 'P')) && (pxVar13[8] == 'E')))) {
            if ((terminate != 0) || (iVar10 = xmlParseLookupGt(ctxt), iVar10 != 0)) {
              ctxt->inSubset = 1;
              xmlParseDocTypeDecl(ctxt);
              xVar3 = *ctxt->input->cur;
              if (xVar3 == '>') {
                xmlNextChar(ctxt);
              }
              else if (xVar3 == '[') {
                ctxt->instate = XML_PARSER_DTD;
                break;
              }
              ctxt->inSubset = 2;
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
                 (p_Var9 = ctxt->sax->externalSubset, p_Var9 != (externalSubsetSAXFunc)0x0)) {
                (*p_Var9)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
              }
              ctxt->inSubset = 0;
              xmlCleanSpecialAttr(ctxt);
              ctxt->instate = XML_PARSER_PROLOG;
              break;
            }
            goto switchD_0013dd64_caseD_ffffffff;
          }
        }
      }
      else if (pxVar13[1] == '?') {
        if ((terminate != 0) ||
           (pxVar13 = xmlParseLookupString(ctxt,2,"?>",2), pxVar13 != (xmlChar *)0x0)) {
          xmlParsePI(ctxt);
          break;
        }
        goto switchD_0013dd64_caseD_ffffffff;
      }
    }
    if (ctxt->instate == XML_PARSER_EPILOG) {
      if (ctxt->errNo == 0) {
        xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
      break;
    }
    goto LAB_0013e84b;
  default:
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INTERNAL_ERROR,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","PP: internal error\n");
    ctxt->instate = XML_PARSER_EOF;
    break;
  case XML_PARSER_DTD:
    if (terminate == 0) {
      uVar15 = ctxt->endCheckState;
      pbVar21 = pxVar13 + ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
      bVar24 = pbVar21 < pbVar19;
      pbVar18 = pbVar21;
      if (bVar24) {
LAB_0013de13:
        bVar2 = *pbVar21;
        uVar22 = uVar15;
        do {
          uVar23 = (uint)bVar2;
          if ((int)uVar22 < 0x2d) {
            if (uVar22 != 0x20) {
              if (uVar22 != 0) {
LAB_0013dedc:
                uVar15 = uVar22;
                if (uVar22 == uVar23) {
                  pbVar18 = pbVar21 + 1;
                  uVar15 = 0;
                }
                goto LAB_0013df26;
              }
              uVar15 = 0;
              if (uVar23 == 0x3b || bVar2 < 0x3b) {
                if ((bVar2 != 0x22) && (uVar15 = 0, bVar2 != 0x27)) goto LAB_0013df26;
              }
              else if (uVar23 != 0x5d) {
                if ((((uVar23 != 0x3c) || (pbVar21[1] != 0x21)) || (pbVar21[2] != 0x2d)) ||
                   (uVar15 = 0, pbVar21[3] != 0x2d)) goto LAB_0013df26;
                pbVar21 = pbVar21 + 4;
                uVar15 = 0x2d;
                pbVar18 = pbVar21;
                goto LAB_0013df29;
              }
LAB_0013df23:
              uVar15 = (uint)bVar2;
              goto LAB_0013df26;
            }
            uVar15 = (uint)bVar2;
            if (uVar15 < 0x3f) {
              if ((0x100002600U >> ((ulong)uVar15 & 0x3f) & 1) != 0) {
                uVar15 = 0x20;
                goto LAB_0013df26;
              }
              if ((ulong)uVar15 == 0x3e) goto LAB_0013e44c;
            }
          }
          else {
            if (uVar22 != 0x5d) {
              if (uVar22 != 0x2d) goto LAB_0013dedc;
              uVar15 = 0x2d;
              if (((bVar2 != 0x2d) || (pbVar21[1] != 0x2d)) || (pbVar21[2] != 0x3e))
              goto LAB_0013df26;
              pbVar21 = pbVar21 + 3;
              uVar15 = 0;
              pbVar18 = pbVar21;
              goto LAB_0013df29;
            }
            if (bVar2 == 0x20) goto LAB_0013df23;
            if (uVar23 == 0x3e) goto LAB_0013e44c;
            uVar15 = 0x20;
            if (((byte)(bVar2 - 9) < 2) || (uVar23 == 0xd)) goto LAB_0013df26;
            if (uVar23 == 0x5d) goto LAB_0013deed;
          }
          uVar22 = 0;
          uVar15 = 0;
          pbVar18 = pbVar21;
          if (!bVar24) break;
        } while( true );
      }
LAB_0013e428:
      if (((uVar15 == 0x2d) || (pbVar19 = pbVar21, uVar15 == 0)) &&
         (pbVar19 = pbVar21 + -3, (long)pbVar21 - (long)pbVar18 < 3)) {
        pbVar19 = pbVar18;
      }
      if (-1 < (long)pbVar19 - (long)pxVar13) {
        ctxt->checkIndex = (long)pbVar19 - (long)pxVar13;
        ctxt->endCheckState = uVar15;
        goto switchD_0013dd64_caseD_ffffffff;
      }
LAB_0013e44c:
      ctxt->checkIndex = 0;
      ctxt->endCheckState = 0;
    }
    xmlParseInternalSubset(ctxt);
    ctxt->inSubset = 2;
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var9 = ctxt->sax->externalSubset, p_Var9 != (externalSubsetSAXFunc)0x0)) {
      (*p_Var9)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
    }
    ctxt->inSubset = 0;
    xmlCleanSpecialAttr(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    break;
  case XML_PARSER_START_TAG:
    local_48 = (xmlChar *)0x0;
    local_50 = (xmlChar *)0x0;
    iVar10 = pxVar20->line;
    local_54 = 0;
    if ((terminate != 0) || (1 < uVar17)) {
      if (*pxVar13 == '<') {
        if ((terminate == 0) && (iVar11 = xmlParseLookupGt(ctxt), iVar11 == 0))
        goto switchD_0013dd64_caseD_ffffffff;
        if (ctxt->spaceNr == 0) {
          iVar11 = -1;
        }
        else {
          iVar11 = *ctxt->space;
          if (*ctxt->space == -2) {
            iVar11 = -1;
          }
        }
        spacePush(ctxt,iVar11);
        if (ctxt->sax2 == 0) {
          pxVar13 = xmlParseStartTag(ctxt);
        }
        else {
          pxVar13 = xmlParseStartTag2(ctxt,&local_48,&local_50,&local_54);
        }
        if (pxVar13 != (xmlChar *)0x0) {
          if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
              (doc = ctxt->myDoc, doc != (xmlDocPtr)0x0)) &&
             ((ctxt->node != (_xmlNode *)0x0 && (ctxt->node == doc->children)))) {
            uVar15 = xmlValidateRoot(local_38,doc);
            ctxt->valid = ctxt->valid & uVar15;
          }
          pxVar20 = ctxt->input;
          pxVar4 = pxVar20->cur;
          if (*pxVar4 == '>') {
            xmlNextChar(ctxt);
            nameNsPush(ctxt,pxVar13,local_48,local_50,iVar10,local_54);
          }
          else if ((*pxVar4 == '/') && (pxVar4[1] == '>')) {
            pxVar20->cur = pxVar4 + 2;
            pxVar20->col = pxVar20->col + 2;
            if (pxVar4[2] == '\0') {
              xmlParserGrow(ctxt);
            }
            p_Var8 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var8 != (_xmlSAXHandler *)0x0) &&
                  (p_Var8->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var8->endElement)(ctxt->userData,pxVar13);
              }
            }
            else {
              if (((p_Var8 != (_xmlSAXHandler *)0x0) &&
                  (p_Var8->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var8->endElementNs)(ctxt->userData,pxVar13,local_48,local_50);
              }
              if (0 < local_54) {
                xmlParserNsPop(ctxt,local_54);
              }
            }
            iVar10 = ctxt->spaceNr;
            if (0 < (long)iVar10) {
              ctxt->spaceNr = iVar10 + -1;
              piVar1 = ctxt->spaceTab + (long)iVar10 + -2;
              piVar16 = ctxt->spaceTab;
              if (iVar10 != 1) {
                piVar16 = piVar1;
              }
              ctxt->space = piVar16;
              piVar1[1] = -1;
            }
          }
          else {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_GT_REQUIRED,XML_ERR_FATAL,
                       pxVar13,(xmlChar *)0x0,(xmlChar *)0x0,0,
                       "Couldn\'t find end of Start Tag %s\n",pxVar13);
            nodePop(ctxt);
            iVar10 = ctxt->spaceNr;
            if (0 < (long)iVar10) {
              ctxt->spaceNr = iVar10 + -1;
              piVar1 = ctxt->spaceTab + (long)iVar10 + -2;
              piVar16 = ctxt->spaceTab;
              if (iVar10 != 1) {
                piVar16 = piVar1;
              }
              ctxt->space = piVar16;
              piVar1[1] = -1;
            }
            if (0 < local_54) {
              xmlParserNsPop(ctxt,local_54);
            }
          }
          xVar12 = XML_PARSER_CONTENT;
          if (ctxt->nameNr == 0) {
            xVar12 = XML_PARSER_EPILOG;
          }
          ctxt->instate = xVar12;
          break;
        }
        iVar10 = ctxt->spaceNr;
        if (0 < (long)iVar10) {
          ctxt->spaceNr = iVar10 + -1;
          piVar1 = ctxt->spaceTab + (long)iVar10 + -2;
          piVar16 = ctxt->spaceTab;
          if (iVar10 != 1) {
            piVar16 = piVar1;
          }
          ctxt->space = piVar16;
          piVar1[1] = -1;
        }
      }
      else {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_DOCUMENT_EMPTY,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Start tag expected, \'<\' not found");
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
    }
    goto switchD_0013dd64_caseD_ffffffff;
  case XML_PARSER_CONTENT:
    if (*pxVar13 == '&') {
      if ((terminate == 0) && (iVar10 = xmlParseLookupChar(ctxt,0x3b), iVar10 == 0))
      goto switchD_0013dd64_caseD_ffffffff;
      xmlParseReference(ctxt);
      break;
    }
    if (*pxVar13 != '<') {
      if ((terminate == 0) && (uVar17 < 300)) {
        pbVar21 = pxVar13 + ctxt->checkIndex;
        pbVar18 = pbVar21;
        if (pbVar21 < pbVar19) {
          pbVar18 = pxVar13 + uVar17;
          do {
            if ((*pbVar21 == 0x26) || (*pbVar21 == 0x3c)) goto LAB_0013e3fe;
            pbVar21 = pbVar21 + 1;
          } while (pbVar21 < pbVar19);
        }
        if (-1 < (long)pbVar18 - (long)pxVar13) {
          ctxt->checkIndex = (long)pbVar18 - (long)pxVar13;
          goto switchD_0013dd64_caseD_ffffffff;
        }
LAB_0013e3fe:
        ctxt->checkIndex = 0;
      }
      ctxt->checkIndex = 0;
      xmlParseCharDataInternal(ctxt,local_3c);
      break;
    }
    if ((terminate == 0) && (uVar17 < 2)) goto switchD_0013dd64_caseD_ffffffff;
    xVar3 = pxVar13[1];
    if (xVar3 != '!') {
      if (xVar3 == '?') {
        if ((terminate == 0) &&
           (pxVar13 = xmlParseLookupString(ctxt,2,"?>",2), pxVar13 == (xmlChar *)0x0))
        goto switchD_0013dd64_caseD_ffffffff;
        xmlParsePI(ctxt);
LAB_0013e5ca:
        ctxt->instate = XML_PARSER_CONTENT;
      }
      else {
        if (xVar3 != '/') goto LAB_0013e84b;
        ctxt->instate = XML_PARSER_END_TAG;
      }
      break;
    }
    if ((terminate == 0) && (uVar17 < 3)) goto switchD_0013dd64_caseD_ffffffff;
    if (pxVar13[2] == '[') {
      if ((terminate == 0) && (uVar17 < 9)) goto switchD_0013dd64_caseD_ffffffff;
      if (((pxVar13[3] == 'C') &&
          (((pxVar13[4] == 'D' && (pxVar13[5] == 'A')) && (pxVar13[6] == 'T')))) &&
         ((pxVar13[7] == 'A' && (pxVar13[8] == '[')))) {
        if ((terminate != 0) ||
           (pxVar13 = xmlParseLookupString(ctxt,9,"]]>",3), pxVar13 != (xmlChar *)0x0)) {
          ctxt->instate = XML_PARSER_CDATA_SECTION;
          xmlParseCDSect(ctxt);
          goto LAB_0013e5ca;
        }
        goto switchD_0013dd64_caseD_ffffffff;
      }
    }
    else {
      if (pxVar13[2] != '-') goto LAB_0013e84b;
      if ((terminate == 0) && (uVar17 < 4)) goto switchD_0013dd64_caseD_ffffffff;
      if (pxVar13[3] == '-') {
        if ((terminate != 0) ||
           (pxVar13 = xmlParseLookupString(ctxt,4,"-->",3), pxVar13 != (xmlChar *)0x0)) {
          xmlParseComment(ctxt);
          goto LAB_0013e5ca;
        }
        goto switchD_0013dd64_caseD_ffffffff;
      }
    }
LAB_0013e84b:
    ctxt->instate = XML_PARSER_START_TAG;
    break;
  case XML_PARSER_END_TAG:
    if (terminate == 0) {
      pxVar20 = (xmlParserInputPtr)0x3e;
      iVar10 = xmlParseLookupChar(ctxt,0x3e);
      if (iVar10 == 0) goto switchD_0013dd64_caseD_ffffffff;
    }
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,(int)pxVar20);
    }
    else {
      xmlParseEndTag2(ctxt,ctxt->pushTab + (long)ctxt->nameNr + -1);
      iVar10 = ctxt->nameNr;
      lVar14 = (long)iVar10;
      if (0 < lVar14) {
        ctxt->nameNr = iVar10 + -1;
        if (iVar10 == 1) {
          pxVar13 = (xmlChar *)0x0;
        }
        else {
          pxVar13 = ctxt->nameTab[lVar14 + -2];
        }
        ctxt->name = pxVar13;
        ctxt->nameTab[lVar14 + -1] = (xmlChar *)0x0;
      }
    }
    if (ctxt->nameNr != 0) goto LAB_0013e5ca;
    ctxt->instate = XML_PARSER_EPILOG;
    break;
  case XML_PARSER_XML_DECL:
    if ((terminate == 0) && (uVar17 < 2)) goto switchD_0013dd64_caseD_ffffffff;
    if ((*pxVar13 == '<') && (pxVar13[1] == '?')) {
      if ((terminate == 0) &&
         (pxVar13 = xmlParseLookupString(ctxt,2,"?>",2), pxVar13 == (xmlChar *)0x0))
      goto switchD_0013dd64_caseD_ffffffff;
      pxVar13 = ctxt->input->cur;
      if ((pxVar13[2] != 'x') ||
         ((((pxVar13[3] != 'm' || (pxVar13[4] != 'l')) || (0x20 < (ulong)pxVar13[5])) ||
          ((0x100002600U >> ((ulong)pxVar13[5] & 0x3f) & 1) == 0)))) goto LAB_0013e199;
      xmlParseXMLDecl(ctxt);
    }
    else {
LAB_0013e199:
      pxVar13 = xmlCharStrdup("1.0");
      ctxt->version = pxVar13;
      if (pxVar13 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        break;
      }
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var6 = ctxt->sax->setDocumentLocator, p_Var6 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var6)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var7 = ctxt->sax->startDocument, p_Var7 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var7)(ctxt->userData);
    }
    ctxt->instate = XML_PARSER_MISC;
    break;
  case XML_PARSER_EOF:
    goto switchD_0013dd64_caseD_ffffffff;
  }
  if (ctxt->disableSAX != 0) goto switchD_0013dd64_caseD_ffffffff;
  goto LAB_0013dd2d;
LAB_0013deed:
  uVar15 = 0x5d;
LAB_0013df26:
  pbVar21 = pbVar21 + 1;
LAB_0013df29:
  bVar24 = pbVar21 < pbVar19;
  if (!bVar24) goto LAB_0013e428;
  goto LAB_0013de13;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    size_t curBase;
    size_t maxLength;
    size_t pos;
    int end_in_lf = 0;
    int res;

    if ((ctxt == NULL) || (size < 0))
        return(XML_ERR_ARGUMENT);
    if ((chunk == NULL) && (size > 0))
        return(XML_ERR_ARGUMENT);
    if ((ctxt->input == NULL) || (ctxt->input->buf == NULL))
        return(XML_ERR_ARGUMENT);
    if (ctxt->disableSAX != 0)
        return(ctxt->errNo);

    ctxt->input->flags |= XML_INPUT_PROGRESSIVE;
    if (ctxt->instate == XML_PARSER_START)
        xmlCtxtInitializeLate(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

    /*
     * Also push an empty chunk to make sure that the raw buffer
     * will be flushed if there is an encoder.
     */
    pos = ctxt->input->cur - ctxt->input->base;
    res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
    if (res < 0) {
        xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
        xmlHaltParser(ctxt);
        return(ctxt->errNo);
    }

    xmlParseTryOrFinish(ctxt, terminate);

    curBase = ctxt->input->cur - ctxt->input->base;
    maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                XML_MAX_HUGE_LENGTH :
                XML_MAX_LOOKUP_LIMIT;
    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
    }

    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX != 0))
        return(ctxt->errNo);

    if (end_in_lf == 1) {
	pos = ctxt->input->cur - ctxt->input->base;
	res = xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");
	xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
        if (res < 0) {
            xmlCtxtErrIO(ctxt, ctxt->input->buf->error, NULL);
            xmlHaltParser(ctxt);
            return(ctxt->errNo);
        }
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
        if ((ctxt->instate != XML_PARSER_EOF) &&
            (ctxt->instate != XML_PARSER_EPILOG)) {
            if (ctxt->nameNr > 0) {
                const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
                int line = ctxt->pushTab[ctxt->nameNr - 1].line;
                xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                        "Premature end of data in tag %s line %d\n",
                        name, line, NULL);
            } else if (ctxt->instate == XML_PARSER_START) {
                xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
            } else {
                xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                               "Start tag expected, '<' not found\n");
            }
        } else if ((ctxt->input->buf->encoder != NULL) &&
                   (ctxt->input->buf->error == 0) &&
                   (!xmlBufIsEmpty(ctxt->input->buf->raw))) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                           "Truncated multi-byte sequence at EOF\n");
        }
	if (ctxt->instate != XML_PARSER_EOF) {
            ctxt->instate = XML_PARSER_EOF;
            xmlFinishDocument(ctxt);
	}
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}